

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Equalizer.cpp
# Opt level: O0

int Equalizer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  bool bVar1;
  uint uVar2;
  Data *data_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float y;
  float killdenormal;
  int i_1;
  uint n;
  float masterGain;
  int iStack_40;
  bool calcSpectrum;
  float specDecay;
  int i;
  float sr;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  data_00 = (Data *)UnityAudioEffectState::GetEffectData<Equalizer::EffectData>(state);
  fVar3 = (float)(state->field_0).field_0.samplerate;
  for (iStack_40 = 0; iStack_40 < inchannels; iStack_40 = iStack_40 + 1) {
    SetupFilterCoeffs(data_00,data_00->FilterH + iStack_40,data_00->FilterP + iStack_40,
                      data_00->FilterL + iStack_40,fVar3);
  }
  fVar3 = powf(10.0,(data_00->p[0xc] * 0.05 * (float)length) / fVar3);
  bVar1 = 0.5 <= data_00->p[0xb];
  if (bVar1) {
    FFTAnalyzer::AnalyzeInput(&data_00->analyzer,inbuffer,inchannels,length,fVar3);
  }
  fVar4 = powf(10.0,data_00->p[0] * 0.05);
  for (killdenormal = 0.0; (uint)killdenormal < length;
      killdenormal = (float)((int)killdenormal + 1)) {
    for (y = 0.0; (int)y < outchannels; y = (float)((int)y + 1)) {
      uVar2 = Random::Get(&data_00->random);
      fVar5 = BiquadFilter::Process
                        (data_00->FilterH + (int)y,
                         inbuffer[(uint)((int)killdenormal * inchannels + (int)y)] +
                         (float)(uVar2 & 0xff) * 1e-09);
      fVar5 = BiquadFilter::Process(data_00->FilterP + (int)y,fVar5);
      fVar5 = BiquadFilter::Process(data_00->FilterL + (int)y,fVar5);
      outbuffer[(uint)((int)killdenormal * outchannels + (int)y)] = fVar5 * fVar4;
    }
  }
  if (bVar1) {
    FFTAnalyzer::AnalyzeOutput(&data_00->analyzer,outbuffer,outchannels,length,fVar3);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float sr = (float)state->samplerate;
        for (int i = 0; i < inchannels; i++)
            SetupFilterCoeffs(data, &data->FilterH[i], &data->FilterP[i], &data->FilterL[i], sr);

        float specDecay = powf(10.0f, 0.05f * data->p[P_SpectrumDecay] * length / sr);
        bool calcSpectrum = (data->p[P_ShowSpectrum] >= 0.5f);
        if (calcSpectrum)
            data->analyzer.AnalyzeInput(inbuffer, inchannels, length, specDecay);

        const float masterGain = powf(10.0f, data->p[P_MasterGain] * 0.05f);
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                float killdenormal = (float)(data->random.Get() & 255) * 1.0e-9f;
                float y = inbuffer[n * inchannels + i] + killdenormal;
                y = data->FilterH[i].Process(y);
                y = data->FilterP[i].Process(y);
                y = data->FilterL[i].Process(y);
                outbuffer[n * outchannels + i] = y * masterGain;
            }
        }

        if (calcSpectrum)
            data->analyzer.AnalyzeOutput(outbuffer, outchannels, length, specDecay);

        return UNITY_AUDIODSP_OK;
    }